

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdapistd.c
# Opt level: O0

boolean jpeg_start_output(j_decompress_ptr cinfo,int scan_number)

{
  boolean bVar1;
  int local_14;
  int scan_number_local;
  j_decompress_ptr cinfo_local;
  
  if ((cinfo->global_state != 0xcf) && (cinfo->global_state != 0xcc)) {
    cinfo->err->msg_code = 0x15;
    (cinfo->err->msg_parm).i[0] = cinfo->global_state;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  local_14 = scan_number;
  if (scan_number < 1) {
    local_14 = 1;
  }
  if ((cinfo->inputctl->eoi_reached != 0) && (cinfo->input_scan_number < local_14)) {
    local_14 = cinfo->input_scan_number;
  }
  cinfo->output_scan_number = local_14;
  bVar1 = output_pass_setup(cinfo);
  return bVar1;
}

Assistant:

GLOBAL(boolean)
jpeg_start_output (j_decompress_ptr cinfo, int scan_number)
{
  if (cinfo->global_state != DSTATE_BUFIMAGE &&
      cinfo->global_state != DSTATE_PRESCAN)
    ERREXIT1(cinfo, JERR_BAD_STATE, cinfo->global_state);
  /* Limit scan number to valid range */
  if (scan_number <= 0)
    scan_number = 1;
  if (cinfo->inputctl->eoi_reached &&
      scan_number > cinfo->input_scan_number)
    scan_number = cinfo->input_scan_number;
  cinfo->output_scan_number = scan_number;
  /* Perform any dummy output passes, and set up for the real pass */
  return output_pass_setup(cinfo);
}